

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_sdot_idx_h_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  long *plVar1;
  uint uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  uintptr_t i;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  uVar2 = (desc & 0x1f) * 8 + 8;
  uVar7 = (ulong)uVar2;
  iVar8 = (int)desc >> 10;
  for (uVar9 = 0; uVar9 < uVar2 >> 3; uVar9 = uVar9 + 2) {
    lVar10 = (long)*(short *)((long)vm + uVar9 * 8 + (long)iVar8 * 8);
    lVar12 = (long)*(short *)((long)vm + uVar9 * 8 + (long)iVar8 * 8 + 2);
    lVar13 = (long)*(short *)((long)vm + uVar9 * 8 + (long)iVar8 * 8 + 4);
    lVar11 = (long)*(short *)((long)vm + uVar9 * 8 + (long)iVar8 * 8 + 6);
    sVar3 = *(short *)((long)vn + uVar9 * 8 + 8);
    sVar4 = *(short *)((long)vn + uVar9 * 8 + 10);
    sVar5 = *(short *)((long)vn + uVar9 * 8 + 0xc);
    sVar6 = *(short *)((long)vn + uVar9 * 8 + 0xe);
    plVar1 = (long *)((long)vd + uVar9 * 8);
    *plVar1 = *plVar1 + *(short *)((long)vn + uVar9 * 8 + 6) * lVar11 +
                        *(short *)((long)vn + uVar9 * 8 + 4) * lVar13 +
                        *(short *)((long)vn + uVar9 * 8 + 2) * lVar12 +
                        *(short *)((long)vn + uVar9 * 8) * lVar10;
    plVar1 = (long *)((long)vd + uVar9 * 8 + 8);
    *plVar1 = *plVar1 + sVar6 * lVar11 + sVar5 * lVar13 + sVar4 * lVar12 + sVar3 * lVar10;
  }
  for (; uVar7 < (desc >> 2 & 0xf8) + 8; uVar7 = uVar7 + 8) {
    *(undefined8 *)((long)vd + uVar7) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_sdot_idx_h)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc), opr_sz_8 = opr_sz / 8;
    intptr_t index = simd_data(desc);
    uint64_t *d = vd;
    int16_t *n = vn;
    int16_t *m_indexed = (int16_t *)vm + index * 4;

    /* This is supported by SVE only, so opr_sz is always a multiple of 16.
     * Process the entire segment all at once, writing back the results
     * only after we've consumed all of the inputs.
     */
    for (i = 0; i < opr_sz_8 ; i += 2) {
        uint64_t d0, d1;

        d0  = n[i * 4 + 0] * (int64_t)m_indexed[i * 4 + 0];
        d0 += n[i * 4 + 1] * (int64_t)m_indexed[i * 4 + 1];
        d0 += n[i * 4 + 2] * (int64_t)m_indexed[i * 4 + 2];
        d0 += n[i * 4 + 3] * (int64_t)m_indexed[i * 4 + 3];
        d1  = n[i * 4 + 4] * (int64_t)m_indexed[i * 4 + 0];
        d1 += n[i * 4 + 5] * (int64_t)m_indexed[i * 4 + 1];
        d1 += n[i * 4 + 6] * (int64_t)m_indexed[i * 4 + 2];
        d1 += n[i * 4 + 7] * (int64_t)m_indexed[i * 4 + 3];

        d[i + 0] += d0;
        d[i + 1] += d1;
    }

    clear_tail(d, opr_sz, simd_maxsz(desc));
}